

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O1

string * __thiscall
google::protobuf::strings::Substitute_abi_cxx11_
          (string *__return_storage_ptr__,strings *this,char *format,SubstituteArg *arg0,
          SubstituteArg *arg1,SubstituteArg *arg2,SubstituteArg *arg3,SubstituteArg *arg4,
          SubstituteArg *arg5,SubstituteArg *arg6,SubstituteArg *arg7,SubstituteArg *arg8,
          SubstituteArg *arg9)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  SubstituteAndAppend(__return_storage_ptr__,(char *)this,(SubstituteArg *)format,arg0,arg1,arg2,
                      arg3,arg4,arg5,arg6,arg7,arg8);
  return __return_storage_ptr__;
}

Assistant:

string Substitute(
    const char* format,
    const SubstituteArg& arg0, const SubstituteArg& arg1,
    const SubstituteArg& arg2, const SubstituteArg& arg3,
    const SubstituteArg& arg4, const SubstituteArg& arg5,
    const SubstituteArg& arg6, const SubstituteArg& arg7,
    const SubstituteArg& arg8, const SubstituteArg& arg9) {
  string result;
  SubstituteAndAppend(&result, format, arg0, arg1, arg2, arg3, arg4,
                                       arg5, arg6, arg7, arg8, arg9);
  return result;
}